

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  PyObject *pPVar1;
  size_t sVar2;
  _func_void_instance_ptr_void_ptr *p_Var3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  local_internals *this_00;
  iterator iVar7;
  PyTypeObject *pPVar8;
  mapped_type value;
  internals *piVar9;
  mapped_type *pmVar10;
  mapped_type *pptVar11;
  vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>> *pvVar12;
  ulong uVar13;
  long lVar14;
  object *poVar15;
  type_info *ptVar16;
  long *plVar17;
  error_already_set *this_01;
  size_type *psVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  internals *piVar19;
  type_index tindex;
  allocator<char> local_91;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pPVar1 = (rec->scope).m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    iVar6 = PyObject_HasAttrString(pPVar1,"__dict__");
    if (iVar6 == 1) {
      local_90._8_8_ = (rec->scope).m_ptr;
      local_80._0_8_ = "__dict__";
      local_80._8_8_ = 0;
      bVar4 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              ::contains<char_const*const&>
                        ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                          *)local_90,&rec->name);
      object::~object((object *)(local_80 + 8));
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,rec->name,&local_91);
        std::operator+(&local_70,"generic_type: cannot initialize type \"",&local_50);
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_90._0_8_ = *plVar17;
        psVar18 = (size_type *)(plVar17 + 2);
        if ((size_type *)local_90._0_8_ == psVar18) {
          local_80._0_8_ = *psVar18;
          local_80._8_8_ = plVar17[3];
          local_90._0_8_ = local_80;
        }
        else {
          local_80._0_8_ = *psVar18;
        }
        local_90._8_8_ = plVar17[1];
        *plVar17 = (long)psVar18;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        pybind11_fail((string *)local_90);
      }
    }
  }
  piVar19 = (internals *)rec->type;
  if ((rec->field_0x60 & 0x10) == 0) {
    __k = &local_70;
    local_70._M_dataplus._M_p = (pointer)piVar19;
    this_00 = (local_internals *)get_internals();
  }
  else {
    local_90._0_8_ = piVar19;
    if (get_local_internals()::locals == '\0') {
      initialize();
    }
    this_00 = &get_local_internals::locals;
    __k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  }
  iVar7 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this_00,(key_type *)__k);
  if ((iVar7.
       super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(long *)((long)iVar7.
                      super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                      ._M_cur + 0x10) != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,rec->name,&local_91);
    std::operator+(&local_70,"generic_type: type \"",&local_50);
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90._0_8_ = *plVar17;
    psVar18 = (size_type *)(plVar17 + 2);
    if ((size_type *)local_90._0_8_ == psVar18) {
      local_80._0_8_ = *psVar18;
      local_80._8_8_ = plVar17[3];
      local_90._0_8_ = local_80;
    }
    else {
      local_80._0_8_ = *psVar18;
    }
    local_90._8_8_ = plVar17[1];
    *plVar17 = (long)psVar18;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    pybind11_fail((string *)local_90);
  }
  pPVar8 = (PyTypeObject *)make_new_python_type(rec);
  (this->super_object).super_handle.m_ptr = (PyObject *)pPVar8;
  value = (mapped_type)operator_new(0x98);
  (value->implicit_conversions).
  super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->implicit_conversions).
  super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->implicit_conversions).
  super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (value->implicit_casts).
  super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->implicit_casts).
  super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->implicit_casts).
  super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value->direct_conversions =
       (vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *)0x0;
  value->get_buffer = (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0;
  value->get_buffer_data = (void *)0x0;
  value->module_local_load = (_func_void_ptr_PyObject_ptr_type_info_ptr *)0x0;
  *(undefined8 *)&value->field_0x90 = 0;
  value->type = pPVar8;
  value->cpptype = rec->type;
  sVar2 = rec->type_align;
  value->type_size = rec->type_size;
  value->type_align = sVar2;
  value->holder_size_in_ptrs = (rec->holder_size - 1 >> 3) + 1;
  p_Var3 = rec->init_instance;
  value->operator_new = rec->operator_new;
  value->init_instance = p_Var3;
  value->dealloc = rec->dealloc;
  value->field_0x90 = (byte)rec->field_0x60 >> 1 & 0xc | 3;
  piVar9 = get_internals();
  local_70._M_dataplus._M_p = (pointer)rec->type;
  pmVar10 = std::__detail::
            _Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&piVar9->direct_conversions,(key_type *)&local_70);
  value->direct_conversions = pmVar10;
  piVar19 = piVar9;
  if ((rec->field_0x60 & 0x10) != 0) {
    if (get_local_internals()::locals == '\0') {
      initialize((generic_type *)local_90);
      piVar19 = (internals *)local_90._0_8_;
    }
    else {
      piVar19 = (internals *)&get_local_internals::locals;
    }
  }
  pptVar11 = std::__detail::
             _Map_base<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)piVar19,(key_type *)&local_70);
  *pptVar11 = value;
  local_50._M_dataplus._M_p = (pointer)(this->super_object).super_handle.m_ptr;
  local_90._0_8_ = value;
  pvVar12 = (vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>> *)
            std::__detail::
            _Map_base<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&piVar9->registered_types_py,(key_type *)&local_50);
  std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>::
  _M_assign_aux<pybind11::detail::type_info*const*>(pvVar12,local_90,local_90 + 8);
  uVar13 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
  if ((uVar13 < 2) && ((rec->field_0x60 & 1) == 0)) {
    lVar14 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
    if (lVar14 != 1) goto LAB_0011836b;
    local_90._8_8_ = (rec->bases).super_object.super_handle.m_ptr;
    local_80._0_8_ = (char *)0x0;
    local_80._8_8_ = 0;
    poVar15 = accessor<pybind11::detail::accessor_policies::list_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::list_item> *)local_90);
    ptVar16 = get_type_info((PyTypeObject *)(poVar15->super_handle).m_ptr);
    object::~object((object *)(local_80 + 8));
    bVar5 = value->field_0x90 & 0xfd | ptVar16->field_0x90 & 2;
  }
  else {
    mark_parents_nonsimple(this,value->type);
    bVar5 = value->field_0x90 & 0xfd;
  }
  value->field_0x90 = bVar5;
LAB_0011836b:
  if ((rec->field_0x60 & 0x10) != 0) {
    value->module_local_load = type_caster_generic::local_load;
    pPVar1 = (this->super_object).super_handle.m_ptr;
    capsule::capsule((capsule *)local_90,value,(char *)0x0,(_func_void_PyObject_ptr *)0x0);
    iVar6 = PyObject_SetAttrString
                      (pPVar1,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__",
                       local_90._0_8_);
    if (iVar6 != 0) {
      this_01 = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this_01);
      __cxa_throw(this_01,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    object::~object((object *)local_90);
  }
  return;
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, "__dict__") && rec.scope.attr("__dict__").contains(rec.name))
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name) +
                          "\": an object with that name is already defined");

        if ((rec.module_local ? get_local_type_info(*rec.type) : get_global_type_info(*rec.type))
            != nullptr)
            pybind11_fail("generic_type: type \"" + std::string(rec.name) +
                          "\" is already registered!");

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->type_align = rec.type_align;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_instance = rec.init_instance;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;
        tinfo->default_holder = rec.default_holder;
        tinfo->module_local = rec.module_local;

        auto &internals = get_internals();
        auto tindex = std::type_index(*rec.type);
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        if (rec.module_local)
            get_local_internals().registered_types_cpp[tindex] = tinfo;
        else
            internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[(PyTypeObject *) m_ptr] = { tinfo };

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        }
        else if (rec.bases.size() == 1) {
            auto parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            tinfo->simple_ancestors = parent_tinfo->simple_ancestors;
        }

        if (rec.module_local) {
            // Stash the local typeinfo and loader so that external modules can access it.
            tinfo->module_local_load = &type_caster_generic::local_load;
            setattr(m_ptr, PYBIND11_MODULE_LOCAL_ID, capsule(tinfo));
        }
    }